

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::deepCopy
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          *sr)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *this_00;
  Configuration *this_01;
  reference ppCVar3;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_28;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_20;
  const_iterator it;
  AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *sr_local;
  RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this_local;
  
  it._M_current = (Configuration **)sr;
  iVar2 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])();
  local_20._M_current =
       (Configuration **)
       std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin
                 ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                  CONCAT44(extraout_var,iVar2));
  while( true ) {
    this_00 = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
              (*(code *)(*it._M_current)[2].super_Loggable._vptr_Loggable)();
    local_28._M_current =
         (Configuration **)
         std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_01 = (Configuration *)operator_new(0x30);
    ppCVar3 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_20);
    Configuration::Configuration(this_01,*ppCVar3);
    (*(this->
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,this_01);
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }